

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallExportGenerator::TempDirCalculate_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  string_view input;
  string *a;
  ulong uVar1;
  string local_60;
  undefined1 local_30 [8];
  cmCryptoHash hasher;
  cmInstallExportGenerator *this_local;
  string *path;
  
  hasher.CTX._7_1_ = 0;
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            (__return_storage_ptr__,a,(char (*) [19])"/CMakeFiles/Export");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_30,AlgoMD5);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    input = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&(this->super_cmInstallGenerator).Destination);
    cmCryptoHash::HashString_abi_cxx11_(&local_60,(cmCryptoHash *)local_30,input);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    hasher.CTX._7_1_ = 1;
    hasher.CTX._0_4_ = 1;
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_30);
  }
  else {
    hasher.CTX._7_1_ = 1;
    hasher.CTX._0_4_ = 1;
  }
  if ((hasher.CTX._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::TempDirCalculate() const
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  std::string path = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), "/CMakeFiles/Export");
  if (this->Destination.empty()) {
    return path;
  }

  cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
  path += '/';
  // Replace the destination path with a hash to keep it short.
  path += hasher.HashString(this->Destination);

  return path;
}